

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_cli.c
# Opt level: O0

void dump_alGetListeneriv
               (CallerInfo *callerinfo,ALenum param,ALint *origvalues,uint32 numvals,ALint *values)

{
  char *pcVar1;
  char *pcVar2;
  uint local_34;
  uint32 i;
  ALint *values_local;
  uint32 numvals_local;
  ALint *origvalues_local;
  ALenum param_local;
  CallerInfo *callerinfo_local;
  
  pcVar1 = alenumString(param);
  pcVar2 = ptrString(origvalues);
  printf("(%s, %s)",pcVar1,pcVar2);
  if (origvalues != (ALint *)0x0) {
    printf(" => {");
    for (local_34 = 0; local_34 < numvals; local_34 = local_34 + 1) {
      pcVar1 = "";
      if (local_34 != 0) {
        pcVar1 = ",";
      }
      printf("%s %d",pcVar1,(ulong)(uint)values[local_34]);
    }
    pcVar1 = "";
    if (numvals != 0) {
      pcVar1 = " ";
    }
    printf("%s}",pcVar1);
  }
  printf("\n");
  return;
}

Assistant:

static void dump_alGetListeneriv(CallerInfo *callerinfo, ALenum param, ALint *origvalues, uint32 numvals, ALint *values)
{
    uint32 i;
    printf("(%s, %s)", alenumString(param), ptrString(origvalues));
    if (origvalues) {
        printf(" => {");
        for (i = 0; i < numvals; i++) {
            printf("%s %d", i > 0 ? "," : "", (int) values[i]);
        }
        printf("%s}", numvals > 0 ? " " : "");
    }
    printf("\n");
}